

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_controller.cpp
# Opt level: O0

void __thiscall
TransactionController_Constructor_Test::~TransactionController_Constructor_Test
          (TransactionController_Constructor_Test *this)

{
  void *in_RDI;
  
  ~TransactionController_Constructor_Test((TransactionController_Constructor_Test *)0x23bc88);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(TransactionController, Constructor) {
  // input-only transaction
  std::string expect_tx = "0200000001efcdab89674523010000000000000000000000000000000000000000000000000000000000ffffffff01406f4001000000001976a9144b8fe2da0c979ec6027dc2287e65569f41d483ec88ac00000000";
  std::string expect_tx2 = "02000000000101aca6c902e9569c99e172c22182f943e4ab15f28602ab248f65c864874a9ddc860000000000ffffffff01005ed0b20000000017a914eca3232c3a28a4d0c03b374d0f6053e9e546e997870247304402205c8a6b770633449f129579776dfd0a839c9749860e17f7a2bde7927e4b9a8c7202205c5a10a57acef9cadd37d72fece91821db547e9c3447f2b1071f664d393b7a5c012102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef00000000";

  TransactionController txc1(expect_tx);
  TransactionController txc2(expect_tx2);

  struct TransactionControllerTest_struct {
    TransactionController txc_a;
    TransactionController txc_b;
  };

  TransactionControllerTest_struct struct_data;
  struct_data.txc_a = txc1;
  struct_data.txc_b = txc2;

  EXPECT_STREQ(struct_data.txc_a.GetHex().c_str(), expect_tx.c_str());
  EXPECT_STREQ(struct_data.txc_b.GetHex().c_str(), expect_tx2.c_str());
}